

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallFileGenerator::LoadConfigFiles(cmExportInstallFileGenerator *this,ostream *os)

{
  ostream *poVar1;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# Load information for each installed configuration.\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(GLOB CONFIG_FILES \"${_DIR}/",0x20);
  GetConfigImportFileGlob_abi_cxx11_(&local_38,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"foreach(f ${CONFIG_FILES})\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  include(${f})\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"endforeach()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::LoadConfigFiles(std::ostream& os)
{
  // Now load per-configuration properties for them.
  /* clang-format off */
  os << "# Load information for each installed configuration.\n"
     << "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
     << "file(GLOB CONFIG_FILES \"${_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(f ${CONFIG_FILES})\n"
     << "  include(${f})\n"
     << "endforeach()\n"
     << "\n";
  /* clang-format on */
}